

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void mg_send_websocket_handshake(mg_connection *nc,char *uri,char *extra_headers)

{
  char *pcVar1;
  unsigned_long random;
  char key [24];
  char *local_40;
  char local_38 [24];
  
  local_40 = uri;
  cs_base64_encode((uchar *)&local_40,8,local_38);
  pcVar1 = "";
  if (extra_headers != (char *)0x0) {
    pcVar1 = extra_headers;
  }
  mg_printf(nc,
            "GET %s HTTP/1.1\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Version: 13\r\nSec-WebSocket-Key: %s\r\n%s\r\n"
            ,uri,local_38,pcVar1);
  return;
}

Assistant:

void mg_send_websocket_handshake(struct mg_connection *nc, const char *uri,
                                 const char *extra_headers) {
    unsigned long random = (unsigned long) uri;
    char key[sizeof(random) * 3];

    mg_base64_encode((unsigned char *) &random, sizeof(random), key);
    mg_printf(nc,
              "GET %s HTTP/1.1\r\n"
                      "Upgrade: websocket\r\n"
                      "Connection: Upgrade\r\n"
                      "Sec-WebSocket-Version: 13\r\n"
                      "Sec-WebSocket-Key: %s\r\n"
                      "%s\r\n",
              uri, key, extra_headers == NULL ? "" : extra_headers);
}